

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrReach.c
# Opt level: O2

DdNode ** Aig_ManCreateOutputs(DdManager *dd,Aig_Man_t *p)

{
  DdNode *n;
  DdNode **ppDVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = (ulong)p->nTruePos;
  ppDVar1 = (DdNode **)malloc(uVar3 << 3);
  for (lVar4 = 0; lVar4 < (int)uVar3; lVar4 = lVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCos,(int)lVar4);
    n = *(DdNode **)((long)pvVar2 + 0x28);
    ppDVar1[lVar4] = n;
    Cudd_Ref(n);
    uVar3 = (ulong)(uint)p->nTruePos;
  }
  return ppDVar1;
}

Assistant:

DdNode ** Aig_ManCreateOutputs( DdManager * dd, Aig_Man_t * p )
{
    DdNode ** pbOutputs;
    Aig_Obj_t * pNode;
    int i;
    // compute the transition relation
    pbOutputs = ABC_ALLOC( DdNode *, Saig_ManPoNum(p) );
    Saig_ManForEachPo( p, pNode, i )
    {
        pbOutputs[i] = Aig_ObjGlobalBdd(pNode);  Cudd_Ref( pbOutputs[i] );
    }
    return pbOutputs;
}